

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O1

vec3 golf_entity_get_velocity(golf_level_t *level,golf_entity_t *entity,float t,vec3 world_point)

{
  golf_transform_t transform;
  golf_transform_t transform_00;
  mat4 m;
  mat4 m_00;
  golf_transform_t transform_01;
  golf_transform_t transform_02;
  mat4 m_01;
  undefined8 unaff_RBX;
  undefined8 unaff_R12;
  golf_movement_t *pgVar1;
  undefined8 unaff_R14;
  undefined8 unaff_R15;
  vec3 vVar2;
  undefined1 in_stack_00000000 [16];
  golf_transform_t transform1;
  golf_transform_t transform0;
  golf_transform_t world_transform;
  mat4 model_mat0;
  mat4 model_mat1;
  golf_transform_t local_160;
  golf_transform_t local_138;
  golf_transform_t local_110;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  
  if ((entity->type == GEO_ENTITY) || (entity->type == MODEL_ENTITY)) {
    pgVar1 = (golf_movement_t *)&(entity->field_4).water.geo;
  }
  else {
    pgVar1 = (golf_movement_t *)0x0;
  }
  if (pgVar1 != (golf_movement_t *)0x0) {
    golf_entity_get_world_transform(&local_110,level,entity);
    local_c8 = *(undefined8 *)((long)&pgVar1->field_4 + 0x10);
    local_e8._0_4_ = pgVar1->type;
    local_e8._4_1_ = pgVar1->repeats;
    local_e8._5_3_ = *(undefined3 *)&pgVar1->field_0x5;
    uStack_e0._0_4_ = pgVar1->t0;
    uStack_e0._4_4_ = pgVar1->length;
    local_d8 = *(undefined8 *)&pgVar1->field_4;
    uStack_d0 = *(undefined8 *)((long)&pgVar1->field_4 + 8);
    transform.position.z = local_110.position.z;
    transform.rotation.x = local_110.rotation.x;
    transform.position.x = local_110.position.x;
    transform.position.y = local_110.position.y;
    transform.rotation.y = local_110.rotation.y;
    transform.rotation.z = local_110.rotation.z;
    transform.rotation.w = local_110.rotation.w;
    transform.scale.x = local_110.scale.x;
    transform.scale.y = local_110.scale.y;
    transform.scale.z = local_110.scale.z;
    golf_transform_apply_movement(&local_138,transform,*pgVar1,t);
    local_c8 = *(undefined8 *)((long)&pgVar1->field_4 + 0x10);
    local_e8._0_4_ = pgVar1->type;
    local_e8._4_1_ = pgVar1->repeats;
    local_e8._5_3_ = *(undefined3 *)&pgVar1->field_0x5;
    uStack_e0._0_4_ = pgVar1->t0;
    uStack_e0._4_4_ = pgVar1->length;
    local_d8 = *(undefined8 *)&pgVar1->field_4;
    uStack_d0 = *(undefined8 *)((long)&pgVar1->field_4 + 8);
    transform_00.position.z = local_110.position.z;
    transform_00.rotation.x = local_110.rotation.x;
    transform_00.position.x = local_110.position.x;
    transform_00.position.y = local_110.position.y;
    transform_00.rotation.y = local_110.rotation.y;
    transform_00.rotation.z = local_110.rotation.z;
    transform_00.rotation.w = local_110.rotation.w;
    transform_00.scale.x = local_110.scale.x;
    transform_00.scale.y = local_110.scale.y;
    transform_00.scale.z = local_110.scale.z;
    golf_transform_apply_movement(&local_160,transform_00,*pgVar1,t + 0.001);
    transform_01.position.z = (float)(int)in_stack_ffffffffffffffd8;
    transform_01.rotation.x = (float)(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
    transform_01.position.x = (float)(int)in_stack_ffffffffffffffd0;
    transform_01.position.y = (float)(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
    transform_01.rotation.y = (float)(int)unaff_RBX;
    transform_01.rotation.z = (float)(int)((ulong)unaff_RBX >> 0x20);
    transform_01.rotation.w = (float)(int)unaff_R12;
    transform_01.scale.x = (float)(int)((ulong)unaff_R12 >> 0x20);
    transform_01.scale.y = (float)(int)unaff_R14;
    transform_01.scale.z = (float)(int)((ulong)unaff_R14 >> 0x20);
    golf_transform_get_model_mat(transform_01);
    transform_02.position.z = (float)(int)in_stack_ffffffffffffffd8;
    transform_02.rotation.x = (float)(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
    transform_02.position.x = (float)(int)in_stack_ffffffffffffffd0;
    transform_02.position.y = (float)(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
    transform_02.rotation.y = (float)(int)unaff_RBX;
    transform_02.rotation.z = (float)(int)((ulong)unaff_RBX >> 0x20);
    transform_02.rotation.w = (float)(int)unaff_R12;
    transform_02.scale.x = (float)(int)((ulong)unaff_R12 >> 0x20);
    transform_02.scale.y = (float)(int)unaff_R14;
    transform_02.scale.z = (float)(int)((ulong)unaff_R14 >> 0x20);
    golf_transform_get_model_mat(transform_02);
    m_01.m[2] = (float)(int)in_stack_ffffffffffffffd8;
    m_01.m[3] = (float)(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
    m_01.m[0] = (float)(int)in_stack_ffffffffffffffd0;
    m_01.m[1] = (float)(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
    m_01.m[4] = (float)(int)unaff_RBX;
    m_01.m[5] = (float)(int)((ulong)unaff_RBX >> 0x20);
    m_01.m[6] = (float)(int)unaff_R12;
    m_01.m[7] = (float)(int)((ulong)unaff_R12 >> 0x20);
    m_01.m[8] = (float)(int)unaff_R14;
    m_01.m[9] = (float)(int)((ulong)unaff_R14 >> 0x20);
    m_01.m[10] = (float)(int)unaff_R15;
    m_01.m[0xb] = (float)(int)((ulong)unaff_R15 >> 0x20);
    m_01.m._48_16_ = in_stack_00000000;
    mat4_inverse(m_01);
    m.m[2] = (float)(undefined4)uStack_98;
    m.m[3] = (float)uStack_98._4_4_;
    m.m[0] = (float)(undefined4)local_a0;
    m.m[1] = (float)local_a0._4_4_;
    m.m[4] = (float)(undefined4)local_90;
    m.m[5] = (float)local_90._4_4_;
    m.m[6] = (float)(undefined4)uStack_88;
    m.m[7] = (float)uStack_88._4_4_;
    m.m[8] = (float)(undefined4)local_80;
    m.m[9] = (float)local_80._4_4_;
    m.m[10] = (float)(undefined4)uStack_78;
    m.m[0xb] = (float)uStack_78._4_4_;
    m.m[0xc] = (float)(undefined4)local_70;
    m.m[0xd] = (float)local_70._4_4_;
    m.m[0xe] = (float)(undefined4)uStack_68;
    m.m[0xf] = (float)uStack_68._4_4_;
    vVar2 = vec3_apply_mat4(world_point,1.0,m);
    m_00.m[2] = (float)(undefined4)uStack_58;
    m_00.m[3] = (float)uStack_58._4_4_;
    m_00.m[0] = (float)(undefined4)local_60;
    m_00.m[1] = (float)local_60._4_4_;
    m_00.m[4] = (float)(undefined4)local_50;
    m_00.m[5] = (float)local_50._4_4_;
    m_00.m[6] = (float)(undefined4)uStack_48;
    m_00.m[7] = (float)uStack_48._4_4_;
    m_00.m[8] = (float)(undefined4)local_40;
    m_00.m[9] = (float)local_40._4_4_;
    m_00.m[10] = (float)(undefined4)uStack_38;
    m_00.m[0xb] = (float)uStack_38._4_4_;
    m_00.m[0xc] = (float)(int)in_stack_ffffffffffffffd0;
    m_00.m[0xd] = (float)(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
    m_00.m[0xe] = (float)(int)in_stack_ffffffffffffffd8;
    m_00.m[0xf] = (float)(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
    vVar2 = vec3_apply_mat4(vVar2,1.0,m_00);
    vVar2 = vec3_sub(vVar2,world_point);
    vVar2 = vec3_scale(vVar2,999.99994);
    return vVar2;
  }
  vVar2 = vec3_create(0.0,0.0,0.0);
  return vVar2;
}

Assistant:

vec3 golf_entity_get_velocity(golf_level_t *level, golf_entity_t *entity, float t, vec3 world_point) {
    float dt = 0.001f;
    golf_movement_t *movement = golf_entity_get_movement(entity);
    if (!movement) {
        return V3(0, 0, 0);
    }

    float t0 = t;
    float t1 = t + dt;

    golf_transform_t world_transform = golf_entity_get_world_transform(level, entity);
    golf_transform_t transform0 = golf_transform_apply_movement(world_transform, *movement, t0);
    golf_transform_t transform1 = golf_transform_apply_movement(world_transform, *movement, t1);
    mat4 model_mat0 = golf_transform_get_model_mat(transform0);
    mat4 model_mat1 = golf_transform_get_model_mat(transform1);
    vec3 local_point = vec3_apply_mat4(world_point, 1, mat4_inverse(model_mat0));
    vec3 world_point1 = vec3_apply_mat4(local_point, 1, model_mat1);

    vec3 velocity = vec3_scale(vec3_sub(world_point1, world_point), 1 / dt);
    return velocity;
}